

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CBlit.h
# Opt level: O2

void irr::executeBlit_TextureBlendColor_16_to_16(SBlitJob *job)

{
  int iVar1;
  void *pvVar2;
  u16 c1;
  u16 uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  void *pvVar7;
  u32 dx;
  ulong uVar8;
  float fVar9;
  float fVar10;
  
  c1 = video::A8R8G8B8toA1R5G5B5(job->argb);
  fVar9 = floorf((float)job->x_stretch * 262144.0 + 0.0);
  fVar10 = floorf((float)job->y_stretch * 262144.0 + 0.0);
  pvVar7 = job->dst;
  iVar5 = 0;
  for (uVar4 = 0; uVar4 < job->height; uVar4 = uVar4 + 1) {
    iVar1 = job->srcPitch;
    pvVar2 = job->src;
    iVar6 = 0;
    for (uVar8 = 0; uVar8 < job->width; uVar8 = uVar8 + 1) {
      uVar3 = *(u16 *)((long)pvVar2 +
                      (long)(iVar6 >> 0x12) * 2 + (long)(iVar5 >> 0x12) * (long)iVar1);
      if ((short)uVar3 < 0) {
        uVar3 = PixelMul16_2(uVar3,c1);
        *(u16 *)((long)pvVar7 + uVar8 * 2) = uVar3;
      }
      iVar6 = iVar6 + (int)fVar9;
    }
    pvVar7 = (void *)((long)pvVar7 + (ulong)job->dstPitch);
    iVar5 = iVar5 + (int)fVar10;
  }
  return;
}

Assistant:

static void executeBlit_TextureBlendColor_16_to_16(const SBlitJob *job)
{
	const u16 blend = video::A8R8G8B8toA1R5G5B5(job->argb);

	const f18 wscale = f32_to_f18(job->x_stretch);
	const f18 hscale = f32_to_f18(job->y_stretch);

	f18 src_y = f18_zero;
	u16 *dst = (u16 *)job->dst;
	for (u32 dy = 0; dy < job->height; ++dy, src_y += hscale) {
		const u16 *src = (u16 *)((u8 *)(job->src) + job->srcPitch * f18_floor(src_y));
		f18 src_x = f18_zero;
		for (u32 dx = 0; dx < job->width; ++dx, src_x += wscale) {
			u16 c0 = src[f18_floor(src_x)];
			if (0 == (c0 & 0x8000))
				continue;

			dst[dx] = PixelMul16_2(c0, blend);
		}
		dst = (u16 *)((u8 *)(dst) + job->dstPitch);
	}
}